

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

bool crnlib::rg_etc1::unpack_etc2_color(void *pBlock,uint *pDst_pixels_rgba,bool preserve_alpha)

{
  bool bVar1;
  byte bVar2;
  ushort uVar3;
  uint c;
  int iVar4;
  uint uVar5;
  long lVar6;
  int c_4;
  ulong uVar7;
  byte bVar8;
  int iVar9;
  ushort uVar10;
  byte bVar11;
  uint uVar12;
  undefined1 uVar13;
  byte bVar14;
  uint uVar15;
  uint i_1;
  uint y;
  uint x;
  int16 dj [3];
  int16 base [3];
  int16 di [3];
  int16 color [3];
  undefined2 local_5e;
  short local_5c;
  short local_5a;
  undefined2 local_58;
  ushort local_56;
  ushort local_54 [2];
  byte abStack_50 [4];
  undefined1 auStack_4c [16];
  ushort local_3c [6];
  
  bVar1 = unpack_etc1_block(pBlock,pDst_pixels_rgba,preserve_alpha);
  if (!bVar1) {
    bVar2 = *pBlock;
    uVar3 = (ushort)bVar2;
    if ((((char)(bVar2 << 5) >> 5) + (bVar2 >> 3) & 0x20) == 0) {
      bVar8 = *(byte *)((long)pBlock + 1);
      if (((bVar8 >> 3) + ((char)(bVar8 << 5) >> 5) & 0x20) == 0) {
        local_58 = (bVar2 >> 5 & 3) + (uVar3 & 0x7e) * 2;
        uVar10 = (ushort)bVar8;
        local_56 = uVar3 & 1 | (uVar3 & 1) << 7 | uVar10 & 0x7e;
        bVar2 = *(byte *)((long)pBlock + 2);
        bVar8 = *(byte *)((long)pBlock + 3);
        local_54[0] = (uVar10 & 1) * 0x80 + (uVar10 & 1) * 2 + (bVar2 & 0x18) * 4 + (bVar2 & 3) * 8
                      | bVar2 >> 4 & 1 | bVar8 >> 5 & 0xfffc;
        bVar2 = *(byte *)((long)pBlock + 5);
        bVar11 = *(byte *)((long)pBlock + 6);
        local_3c[0] = ((bVar2 >> 1 & 3 | (bVar2 & 7) << 5) + (ushort)(bVar11 >> 5) * 4) - local_58;
        bVar14 = *(byte *)((long)pBlock + 7);
        local_3c[1] = ((bVar14 >> 5 & 0xfffe) + (bVar11 & 0x1f) * 8 +
                      (ushort)((bVar11 >> 4 & 1) != 0)) - local_56;
        local_3c[2] = ((bVar14 >> 4 & 3) - local_54[0]) + (bVar14 & 0x3f) * 4;
        local_5e = ((bVar8 >> 5 & 3) - local_58) + (bVar8 & 1) * 4 + (bVar8 & 0x7c) * 2;
        bVar8 = *(byte *)((long)pBlock + 4);
        local_5c = ((ushort)(bVar8 >> 7) | bVar8 & 0xfffe) - local_56;
        local_5a = (((ushort)(bVar2 >> 7) | bVar2 >> 1 & 0xfffc | (bVar8 & 1) << 7) +
                   (bVar8 & 1) * 2) - local_54[0];
        for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
          (&local_58)[lVar6] = (&local_58)[lVar6] * 4 + 2;
        }
        for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
          for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
            uVar3 = (&local_58)[lVar6];
            local_3c[lVar6 + 3] = uVar3;
            (&local_58)[lVar6] = uVar3 + local_3c[lVar6];
          }
          for (iVar9 = 0; iVar9 != 4; iVar9 = iVar9 + 1) {
            for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
              uVar12 = (uint)local_3c[lVar6 + 3];
              if (0x3fb < (short)local_3c[lVar6 + 3]) {
                uVar12 = 0x3fc;
              }
              if ((short)uVar12 < 1) {
                uVar12 = 0;
              }
              *(char *)((long)pDst_pixels_rgba + lVar6) = (char)(uVar12 >> 2);
              local_3c[lVar6 + 3] = local_3c[lVar6 + 3] + (&local_5e)[lVar6];
            }
            if (!preserve_alpha) {
              *(undefined1 *)((long)pDst_pixels_rgba + 3) = 0xff;
            }
            pDst_pixels_rgba = pDst_pixels_rgba + 1;
          }
        }
        return true;
      }
      bVar8 = *(byte *)((long)pBlock + 2);
      bVar11 = *(byte *)((long)pBlock + 1);
      bVar14 = *(byte *)((long)pBlock + 3);
      local_5e = CONCAT11(bVar8 << 5 | bVar2 * '\x02' & 0xe | bVar11 >> 4 & 1 | bVar14 >> 3 & 0x10,
                          bVar8 * '\x02' & 0xf0 | bVar2 >> 3 & 0xf);
      bVar8 = bVar14 * '\x02' & 0xf0 | bVar11 & 8 | bVar8 >> 7 | bVar11 * '\x02' & 6;
      bVar2 = (bVar14 * '\x02' & 2 | bVar14 & 4) + 1;
      iVar4 = 0;
      for (uVar7 = 0; (iVar4 == 0 && (uVar7 < 3)); uVar7 = uVar7 + 1) {
        iVar4 = (*(byte *)((long)&local_5e + uVar7) & 0xf) -
                (uint)(*(byte *)((long)&local_5e + uVar7) >> 4);
        bVar2 = ((byte)((uint)iVar4 >> 0x1f) ^ 7) & bVar2;
      }
      bVar2 = *(byte *)((long)&g_etc2_modifier_table + (ulong)bVar2);
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        bVar11 = *(byte *)((long)&local_5e + lVar6);
        bVar14 = bVar11 & 0xf | bVar11 << 4;
        uVar12 = (uint)(byte)(bVar11 & 0xf0 | bVar11 >> 4);
        iVar4 = uVar12 - bVar2;
        uVar13 = (undefined1)iVar4;
        if (iVar4 < 1) {
          uVar13 = 0;
        }
        *(undefined1 *)((long)&local_58 + lVar6) = uVar13;
        uVar12 = uVar12 + bVar2;
        if (0xfe < uVar12) {
          uVar12 = 0xff;
        }
        uVar15 = (uint)bVar14 + (uint)bVar2;
        if (0xfe < uVar15) {
          uVar15 = 0xff;
        }
        *(char *)((long)local_54 + lVar6) = (char)uVar12;
        abStack_50[lVar6] = (byte)uVar15;
        iVar4 = (uint)bVar14 - (uint)bVar2;
        uVar13 = (undefined1)iVar4;
        if (iVar4 < 1) {
          uVar13 = 0;
        }
        auStack_4c[lVar6] = uVar13;
      }
    }
    else {
      local_5e = CONCAT11(*(byte *)((long)pBlock + 1) >> 4 | *(byte *)((long)pBlock + 2) << 4,
                          *(byte *)((long)pBlock + 2) & 0xf0 | bVar2 >> 1 & 0xc | bVar2 & 3);
      bVar2 = *(byte *)((long)pBlock + 3);
      bVar8 = bVar2 & 0xf0 | *(byte *)((long)pBlock + 1) & 0xf;
      bVar2 = *(byte *)((long)&g_etc2_modifier_table + (ulong)(bVar2 >> 1 & 6 | bVar2 & 1));
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        bVar11 = *(byte *)((long)&local_5e + lVar6);
        abStack_50[lVar6] = bVar11 & 0xf | bVar11 << 4;
        bVar11 = bVar11 & 0xf0 | bVar11 >> 4;
        uVar12 = (uint)bVar2;
        iVar4 = bVar11 - uVar12;
        uVar13 = (undefined1)iVar4;
        if (iVar4 < 1) {
          uVar13 = 0;
        }
        *(byte *)((long)local_54 + lVar6) = bVar11;
        *(undefined1 *)((long)&local_58 + lVar6) = uVar13;
        uVar12 = bVar11 + uVar12;
        uVar13 = (undefined1)uVar12;
        if (0xfe < uVar12) {
          uVar13 = 0xff;
        }
        auStack_4c[lVar6] = uVar13;
      }
    }
    local_5c = CONCAT11(local_5c._1_1_,bVar8);
    for (y = 0; y != 4; y = y + 1) {
      for (x = 0; x != 4; x = x + 1) {
        uVar5 = etc1_block::get_selector((etc1_block *)pBlock,x,y);
        uVar7 = (ulong)uVar5;
        *(undefined1 *)pDst_pixels_rgba = *(undefined1 *)(&local_58 + uVar7 * 2);
        *(undefined1 *)((long)pDst_pixels_rgba + 1) =
             *(undefined1 *)((long)&local_58 + uVar7 * 4 + 1);
        *(char *)((long)pDst_pixels_rgba + 2) = (char)local_54[uVar7 * 2 + -1];
        if (!preserve_alpha) {
          *(undefined1 *)((long)pDst_pixels_rgba + 3) = 0xff;
        }
        pDst_pixels_rgba = pDst_pixels_rgba + 1;
      }
    }
  }
  return true;
}

Assistant:

bool unpack_etc2_color(const void* pBlock, unsigned int* pDst_pixels_rgba, bool preserve_alpha) {
  if (unpack_etc1_block(pBlock, pDst_pixels_rgba, preserve_alpha))
    return true;

  color_quad_u8* pDst = reinterpret_cast<color_quad_u8*>(pDst_pixels_rgba);
  const etc1_block& block = *static_cast<const etc1_block*>(pBlock);
  const uint8* B = block.m_bytes;
  const bool rOverflow = ((int8(B[0] << 5) >> 5) + (B[0] >> 3)) & 0x20;
  const bool gOverflow = ((int8(B[1] << 5) >> 5) + (B[1] >> 3)) & 0x20;

  if (rOverflow || gOverflow) {
    color_quad_u8 block_colors[4];
    uint8 unpacked[3];
    if (rOverflow) {
      unpacked[0] = (B[0] & 0x3) | (B[0] >> 1 & 0xC) | (B[2] & 0xF0);
      unpacked[1] = B[1] >> 4 | B[2] << 4;
      unpacked[2] = (B[1] & 0xF) | (B[3] & 0xF0);
      uint8 delta = g_etc2_modifier_table[(B[3] & 1) | (B[3] >> 1 & 6)];
      for (uint c = 0; c < 3; c++) {
        block_colors[2][c] = unpacked[c] << 4 | (unpacked[c] & 0xF);
        block_colors[1][c] = unpacked[c] >> 4 | (unpacked[c] & 0xF0);
        block_colors[0][c] = math::maximum(0, block_colors[1][c] - delta);
        block_colors[3][c] = math::minimum(255, block_colors[1][c] + delta);
      }
    } else {
      unpacked[0] = (B[0] >> 3 & 0xF) | (B[2] << 1 & 0xF0);
      unpacked[1] = (B[1] >> 4 & 0x1) | (B[0] << 1 & 0xE) | (B[3] >> 3 & 0x10) | B[2] << 5;
      unpacked[2] = B[2] >> 7 | (B[1] << 1 & 0x6) | (B[1] & 0x8) | (B[3] << 1 & 0xF0);
      uint8 modifier = (B[3] & 4) | (B[3] << 1 & 2) | 1;
      for (int d = 0, c = 0; !d && c < 3; c++, modifier &= d < 0 ? 6 : 7)
        d = (unpacked[c] & 0xF) - (unpacked[c] >> 4);
      uint8 delta = g_etc2_modifier_table[modifier];
      for (uint c = 0; c < 3; c++) {
        uint8 c0 = unpacked[c] << 4 | (unpacked[c] & 0xF);
        uint8 c1 = unpacked[c] >> 4 | (unpacked[c] & 0xF0);
        block_colors[0][c] = math::maximum(0, c1 - delta);
        block_colors[1][c] = math::minimum(255, c1 + delta);
        block_colors[2][c] = math::minimum(255, c0 + delta);
        block_colors[3][c] = math::maximum(0, c0 - delta);
      }
    }
    for (uint i = 0; i < 4; i++) {
      for (uint j = 0; j < 4; j++, pDst++) {
        pDst->set_rgb(block_colors[block.get_selector(j, i)]);
        if (!preserve_alpha)
          pDst->a = 255;
      }
    }
  } else {
    int16 base[3], dj[3], di[3], color[3];
    base[0] = (B[0] << 1 & 0xFC) | (B[0] >> 5 & 3);
    base[1] = (B[0] << 7 & 0x80) | (B[1] & 0x7E) | (B[0] & 1);
    base[2] = (B[1] << 7 & 0x80) | (B[2] << 2 & 0x60) | (B[2] << 3 & 0x18) | (B[3] >> 5 & 4) | (B[1] << 1 & 2) | (B[2] >> 4 & 1);
    di[0] = ((B[5] << 5 & 0xE0) | (B[6] >> 3 & 0x1C) | (B[5] >> 1 & 0x3)) - base[0];
    di[1] = ((B[6] << 3 & 0xF8) | (B[7] >> 5 & 0x6) | (B[6] >> 4 & 0x1)) - base[1];
    di[2] = ((B[7] << 2 & 0xFC) | (B[7] >> 4 & 0x3)) - base[2];
    dj[0] = ((B[3] << 1 & 0xF8) | (B[3] << 2 & 0x4) | (B[3] >> 5 & 0x3)) - base[0];
    dj[1] = ((B[4] & 0xFE) | B[4] >> 7) - base[1];
    dj[2] = ((B[4] << 7 & 0x80) | (B[5] >> 1 & 0x7C) | (B[4] << 1 & 0x2) | B[5] >> 7) - base[2];
    for (uint c = 0; c < 3; c++)
      base[c] = (base[c] << 2) + 2;
    for (uint i = 0; i < 4; i++) {
      for (uint c = 0; c < 3; base[c] += di[c], c++)
        color[c] = base[c];
      for (uint j = 0; j < 4; j++, pDst++) {
        for (uint c = 0; c < 3; color[c] += dj[c], c++)
          pDst->c[c] = math::clamp<int16>(color[c], 0, 1020) >> 2;
        if (!preserve_alpha)
          pDst->a = 255;
      }
    }
  }
  return true;
}